

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  long lVar5;
  undefined8 *puVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  stbi_uc sVar12;
  byte *pbVar13;
  byte *pbVar14;
  stbi_uc *psVar15;
  ulong uVar16;
  uint uVar17;
  stbi__uint32 sVar18;
  stbi__uint32 sVar19;
  uint uVar20;
  char *pcVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar13 = a->zbuffer;
    pbVar2 = a->zbuffer_end;
    uVar7 = 0;
    if (pbVar13 < pbVar2) {
      a->zbuffer = pbVar13 + 1;
      bVar4 = *pbVar13;
      pbVar13 = pbVar13 + 1;
    }
    else {
      bVar4 = 0;
    }
    pbVar14 = pbVar13;
    if (pbVar13 < pbVar2) {
      pbVar14 = pbVar13 + 1;
      a->zbuffer = pbVar14;
      uVar7 = (ushort)*pbVar13;
    }
    if ((((pbVar2 <= pbVar14) || (0x842 < (ushort)(((ushort)bVar4 << 8 | uVar7) * 0x7bdf))) ||
        ((uVar7 & 0x20) != 0)) || ((bVar4 & 0xf) != 8)) {
LAB_001bd2c2:
      puVar6 = (undefined8 *)__tls_get_addr(&PTR_001f3f18);
      *puVar6 = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->hit_zeof_once = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  iVar22 = 0;
  do {
    if (iVar22 < 1) {
      stbi__fill_bits(a);
      iVar22 = a->num_bits;
    }
    uVar1 = a->code_buffer;
    sVar18 = uVar1 >> 1;
    a->code_buffer = sVar18;
    iVar8 = iVar22 + -1;
    a->num_bits = iVar8;
    if (iVar22 < 3) {
      stbi__fill_bits(a);
      iVar8 = a->num_bits;
      sVar18 = a->code_buffer;
    }
    sVar19 = sVar18 >> 2;
    a->code_buffer = sVar19;
    uVar17 = iVar8 - 2;
    a->num_bits = uVar17;
    iVar22 = 0;
    switch(sVar18 & 3) {
    case 0:
      if ((uVar17 & 7) != 0) {
        stbi__zreceive(a,uVar17 & 7);
        uVar17 = a->num_bits;
      }
      if ((int)uVar17 < 1) {
        if ((int)uVar17 < 0) goto LAB_001bd2c2;
        uVar24 = 0;
LAB_001bd216:
        psVar15 = a->zbuffer;
        psVar3 = a->zbuffer_end;
        do {
          if (psVar15 < psVar3) {
            a->zbuffer = psVar15 + 1;
            sVar12 = *psVar15;
            psVar15 = psVar15 + 1;
          }
          else {
            sVar12 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar24) = sVar12;
          uVar24 = uVar24 + 1;
        } while (uVar24 != 4);
      }
      else {
        uVar9 = a->code_buffer;
        uVar20 = uVar17 - 1 >> 3;
        uVar24 = (ulong)(uVar20 + 1);
        uVar16 = 0xffffffffffffffff;
        do {
          *(char *)((long)local_814.fast + uVar16 + 1) = (char)uVar9;
          uVar9 = uVar9 >> 8;
          uVar16 = uVar16 + 1;
        } while (uVar20 != uVar16);
        iVar22 = uVar17 - (uVar17 - 1 & 0xfffffff8);
        a->code_buffer = uVar9;
        a->num_bits = iVar22 + -8;
        if (iVar22 != 8) goto LAB_001bd2c2;
        if (uVar16 < 3) goto LAB_001bd216;
      }
      if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
        psVar15 = a->zbuffer;
        uVar24 = (ulong)local_814.fast[0];
        if (psVar15 + uVar24 <= a->zbuffer_end) {
          pcVar21 = a->zout;
          if (a->zout_end < pcVar21 + uVar24) {
            iVar22 = stbi__zexpand(a,pcVar21,(uint)local_814.fast[0]);
            if (iVar22 == 0) {
              return 0;
            }
            psVar15 = a->zbuffer;
            pcVar21 = a->zout;
          }
          memcpy(pcVar21,psVar15,uVar24);
          a->zbuffer = a->zbuffer + uVar24;
          a->zout = a->zout + uVar24;
          goto LAB_001bd2a3;
        }
      }
      goto LAB_001bd2c2;
    case 1:
      iVar22 = stbi__zbuild_huffman
                         (z,
                          "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                          ,0x120);
      if (iVar22 == 0) {
        return 0;
      }
      psVar15 = 
      "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
      ;
      iVar22 = 0x20;
      break;
    case 2:
      if (iVar8 < 7) {
        stbi__fill_bits(a);
        uVar17 = a->num_bits;
        sVar19 = a->code_buffer;
      }
      sVar18 = sVar19 >> 5;
      a->code_buffer = sVar18;
      iVar22 = uVar17 - 5;
      a->num_bits = iVar22;
      if ((int)uVar17 < 10) {
        stbi__fill_bits(a);
        iVar22 = a->num_bits;
        sVar18 = a->code_buffer;
      }
      uVar17 = sVar18 >> 5;
      a->code_buffer = uVar17;
      iVar8 = iVar22 + -5;
      a->num_bits = iVar8;
      if (iVar22 < 9) {
        stbi__fill_bits(a);
        iVar8 = a->num_bits;
        uVar17 = a->code_buffer;
      }
      uVar20 = (sVar19 & 0x1f) + 0x101;
      iVar22 = (sVar18 & 0x1f) + 1;
      uVar9 = uVar17 >> 4;
      a->code_buffer = uVar9;
      iVar8 = iVar8 + -4;
      a->num_bits = iVar8;
      local_a08[0] = 0;
      local_a08[1] = 0;
      local_a08[2] = 0;
      local_a08[3] = 0;
      local_a08[4] = 0;
      local_a08[5] = 0;
      local_a08[6] = 0;
      local_a08[7] = 0;
      local_a08[8] = 0;
      local_a08[9] = 0;
      local_a08[10] = 0;
      local_a08[0xb] = 0;
      local_a08[0xc] = 0;
      local_a08[0xd] = 0;
      local_a08[0xe] = 0;
      local_a08[0xf] = 0;
      local_a08[0x10] = 0;
      local_a08[0x11] = 0;
      local_a08[0x12] = 0;
      uVar24 = 0;
      do {
        uVar10 = uVar9;
        if (iVar8 < 3) {
          stbi__fill_bits(a);
          iVar8 = a->num_bits;
          uVar10 = a->code_buffer;
        }
        uVar9 = uVar10 >> 3;
        a->code_buffer = uVar9;
        iVar8 = iVar8 + -3;
        a->num_bits = iVar8;
        local_a08[(byte)(&stbi__compute_huffman_codes_length_dezigzag)[uVar24]] = (byte)uVar10 & 7;
        uVar24 = uVar24 + 1;
      } while ((uVar17 & 0xf) + 4 != uVar24);
      iVar8 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
      if (iVar8 == 0) {
        return 0;
      }
      iVar23 = iVar22 + uVar20;
      iVar8 = 0;
      do {
        uVar17 = stbi__zhuffman_decode(a,&local_814);
        if (0x12 < uVar17) goto LAB_001bd2c2;
        if (uVar17 < 0x10) {
          local_9e8[iVar8] = (char)uVar17;
          iVar8 = iVar8 + 1;
        }
        else {
          iVar11 = a->num_bits;
          if (uVar17 == 0x11) {
            if (iVar11 < 3) {
              stbi__fill_bits(a);
              iVar11 = a->num_bits;
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> 3;
            a->num_bits = iVar11 + -3;
            uVar17 = (uVar17 & 7) + 3;
LAB_001bd041:
            uVar9 = 0;
          }
          else {
            if (uVar17 != 0x10) {
              if (iVar11 < 7) {
                stbi__fill_bits(a);
                iVar11 = a->num_bits;
              }
              uVar17 = a->code_buffer;
              a->code_buffer = uVar17 >> 7;
              a->num_bits = iVar11 + -7;
              uVar17 = (uVar17 & 0x7f) + 0xb;
              goto LAB_001bd041;
            }
            if (iVar11 < 2) {
              stbi__fill_bits(a);
              iVar11 = a->num_bits;
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> 2;
            a->num_bits = iVar11 + -2;
            if (iVar8 == 0) goto LAB_001bd2c2;
            uVar17 = (uVar17 & 3) + 3;
            uVar9 = (uint)(&bStack_9e9)[iVar8];
          }
          if (iVar23 - iVar8 < (int)uVar17) goto LAB_001bd2c2;
          memset(local_9e8 + iVar8,uVar9,(ulong)uVar17);
          iVar8 = iVar8 + uVar17;
        }
      } while (iVar8 < iVar23);
      if (iVar8 != iVar23) goto LAB_001bd2c2;
      iVar8 = stbi__zbuild_huffman(z,local_9e8,uVar20);
      if (iVar8 == 0) {
        return 0;
      }
      psVar15 = local_9e8 + uVar20;
      break;
    case 3:
      goto switchD_001bcdd0_caseD_3;
    }
    iVar22 = stbi__zbuild_huffman(&a->z_distance,psVar15,iVar22);
    if (iVar22 == 0) {
      return 0;
    }
    pcVar21 = a->zout;
    while( true ) {
      while (uVar17 = stbi__zhuffman_decode(a,z), (int)uVar17 < 0x100) {
        if ((int)uVar17 < 0) goto LAB_001bd2c2;
        if (a->zout_end <= pcVar21) {
          iVar22 = stbi__zexpand(a,pcVar21,1);
          if (iVar22 == 0) {
            return 0;
          }
          pcVar21 = a->zout;
        }
        *pcVar21 = (char)uVar17;
        pcVar21 = pcVar21 + 1;
      }
      if (uVar17 == 0x100) break;
      if (0x11d < uVar17) goto LAB_001bd2c2;
      uVar24 = (ulong)(uVar17 - 0x101);
      uVar17 = stbi__zlength_base[uVar24];
      if (0xffffffffffffffeb < uVar24 - 0x1c) {
        uVar9 = stbi__zreceive(a,stbi__zlength_extra[uVar24]);
        uVar17 = uVar17 + uVar9;
      }
      uVar9 = stbi__zhuffman_decode(a,&a->z_distance);
      if (0x1d < uVar9) goto LAB_001bd2c2;
      iVar22 = stbi__zdist_base[uVar9];
      if (3 < uVar9) {
        uVar9 = stbi__zreceive(a,stbi__zdist_extra[uVar9]);
        iVar22 = iVar22 + uVar9;
      }
      if ((long)pcVar21 - (long)a->zout_start < (long)iVar22) goto LAB_001bd2c2;
      if ((long)a->zout_end - (long)pcVar21 < (long)(int)uVar17) {
        iVar8 = stbi__zexpand(a,pcVar21,uVar17);
        if (iVar8 == 0) {
          return 0;
        }
        pcVar21 = a->zout;
      }
      lVar5 = -(long)iVar22;
      if (iVar22 == 1) {
        if (uVar17 != 0) {
          memset(pcVar21,(uint)(byte)pcVar21[lVar5],(ulong)uVar17);
          pcVar21 = pcVar21 + (ulong)(uVar17 - 1) + 1;
        }
      }
      else {
        for (; uVar17 != 0; uVar17 = uVar17 - 1) {
          *pcVar21 = pcVar21[lVar5];
          pcVar21 = pcVar21 + 1;
        }
      }
    }
    a->zout = pcVar21;
    if ((a->hit_zeof_once != 0) && (a->num_bits < 0x10)) goto LAB_001bd2c2;
LAB_001bd2a3:
    if ((uVar1 & 1) != 0) {
      iVar22 = 1;
switchD_001bcdd0_caseD_3:
      return iVar22;
    }
    iVar22 = a->num_bits;
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}